

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O2

DWORD GetEnvironmentVariableA(LPCSTR lpName,LPSTR lpBuffer,DWORD nSize)

{
  char *pcVar1;
  size_t sVar2;
  DWORD DVar3;
  DWORD dwErrCode;
  byte bVar4;
  
  bVar4 = PAL_InitializeChakraCoreCalled;
  if (PAL_InitializeChakraCoreCalled) {
    DVar3 = 0;
    if (lpName == (LPCSTR)0x0) {
      dwErrCode = 0x57;
    }
    else {
      dwErrCode = 0xcb;
      DVar3 = 0;
      if (*lpName != '\0') {
        pcVar1 = strchr(lpName,0x3d);
        if ((pcVar1 == (char *)0x0) &&
           (pcVar1 = MiscGetenv(lpName), bVar4 = PAL_InitializeChakraCoreCalled,
           pcVar1 != (char *)0x0)) {
          sVar2 = strlen(pcVar1);
          if (sVar2 < nSize) {
            strcpy_s(lpBuffer,(ulong)nSize,pcVar1);
            sVar2 = strlen(pcVar1);
            DVar3 = (DWORD)sVar2;
          }
          else {
            DVar3 = (int)sVar2 + 1;
          }
          dwErrCode = 0;
        }
        else if ((bVar4 & 1) == 0) goto LAB_0032e607;
      }
    }
    SetLastError(dwErrCode);
    if (PAL_InitializeChakraCoreCalled != false) {
      return DVar3;
    }
  }
LAB_0032e607:
  abort();
}

Assistant:

DWORD
PALAPI
GetEnvironmentVariableA(
            IN LPCSTR lpName,
            OUT LPSTR lpBuffer,
            IN DWORD nSize)
{
    char  *value;
    DWORD dwRet = 0;

    PERF_ENTRY(GetEnvironmentVariableA);
    ENTRY("GetEnvironmentVariableA(lpName=%p (%s), lpBuffer=%p, nSize=%u)\n",
        lpName?lpName:"NULL",
        lpName?lpName:"NULL", lpBuffer, nSize);
    
    if (lpName == NULL)
    {
        ERROR("lpName is NULL\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        goto done;
    }

    if (lpName[0] == 0)
    {
        TRACE("lpName is empty string\n", lpName);
        SetLastError(ERROR_ENVVAR_NOT_FOUND);
        goto done;
    }
    
    if (strchr(lpName, '=') != NULL)
    {
        // GetEnvironmentVariable doesn't permit '=' in variable names.
        value = NULL;
    }
    else
    {
        value = MiscGetenv(lpName);
    }
    
    if (value == NULL)
    {
        TRACE("%s is not found\n", lpName);
        SetLastError(ERROR_ENVVAR_NOT_FOUND);
        goto done;
    }

    if (strlen(value) < nSize)
    {
        strcpy_s(lpBuffer, nSize, value);
        dwRet = strlen(value);
    } 
    else 
    {
        dwRet = strlen(value)+1;
    }
    SetLastError(ERROR_SUCCESS);

done:
    LOGEXIT("GetEnvironmentVariableA returns DWORD 0x%x\n", dwRet);
    PERF_EXIT(GetEnvironmentVariableA);
    return dwRet;
}